

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref.h
# Opt level: O0

void __thiscall embree::RefCount::refDec(RefCount *this)

{
  long lVar1;
  long *plVar2;
  long *in_RDI;
  
  plVar2 = in_RDI + 1;
  LOCK();
  lVar1 = *plVar2;
  *plVar2 = *plVar2 + -1;
  UNLOCK();
  if ((lVar1 == 1) && (in_RDI != (long *)0x0)) {
    (**(code **)(*in_RDI + 8))();
  }
  return;
}

Assistant:

virtual void refDec() { if (refCounter.fetch_add(-1) == 1) delete this; }